

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall ON_Material::IsPhysicallyBased(ON_Material *this)

{
  ON_UUID local_30;
  ON_UserData *local_20;
  ON_PhysicallyBasedMaterialUserData *pUD;
  ON_Material *this_local;
  
  pUD = (ON_PhysicallyBasedMaterialUserData *)this;
  local_30 = ON_ClassId::Uuid(&ON_PhysicallyBasedMaterialUserData::
                               m_ON_PhysicallyBasedMaterialUserData_class_rtti);
  local_20 = ON_Object::GetUserData((ON_Object *)this,&local_30);
  if (local_20 == (ON_UserData *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = ON_4fColor::IsValid((ON_4fColor *)(local_20 + 1),(ON_TextLog *)0x0);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Material::IsPhysicallyBased(void) const
{
  //Optimized version
  const auto pUD = static_cast<ON_PhysicallyBasedMaterialUserData*>(GetUserData(ON_CLASS_ID(ON_PhysicallyBasedMaterialUserData)));
  if (nullptr == pUD)
    return false;

  //https://mcneel.myjetbrains.com/youtrack/issue/RH-68577
  return pUD->m_parameters.base_color.IsValid();

  //return nullptr != PhysicallyBased();
}